

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t unpack_half_to_float_3chan_interleave_rev(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int y;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint8_t *puVar10;
  short *psVar11;
  uint uVar12;
  long lVar13;
  short *psVar14;
  
  iVar7 = decode->user_line_begin_skip;
  iVar5 = (decode->chunk).height - decode->user_line_end_ignore;
  if (iVar7 < iVar5) {
    peVar3 = decode->channels;
    uVar1 = peVar3->width;
    psVar11 = (short *)((long)(int)(uVar1 * 6 * iVar7) + (long)decode->unpacked_buffer);
    puVar10 = peVar3[2].field_12.decode_to_ptr;
    iVar2 = peVar3->user_line_stride;
    do {
      if (0 < (int)uVar1) {
        lVar13 = 0;
        psVar14 = psVar11;
        do {
          uVar8 = (uint)psVar14[(long)(int)uVar1 * 2];
          uVar12 = (uVar8 & 0x7fff) << 0xd;
          uVar9 = uVar8 & 0x80000000;
          if (uVar12 < 0x800000) {
            if ((uVar8 & 0x7fff) != 0) {
              uVar4 = 0x1f;
              if ((uVar8 & 0x7fff) != 0) {
                for (; uVar12 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                }
              }
              iVar6 = (uVar4 ^ 0x1f) - 8;
              uVar9 = (uVar9 | uVar12 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar12 < 0xf800000) {
            uVar9 = (uVar9 | uVar12) + 0x38000000;
          }
          else {
            uVar9 = uVar9 | uVar12 | 0x7f800000;
          }
          *(uint *)(puVar10 + lVar13) = uVar9;
          uVar8 = (uint)psVar14[(int)uVar1];
          uVar12 = (uVar8 & 0x7fff) << 0xd;
          uVar9 = uVar8 & 0x80000000;
          if (uVar12 < 0x800000) {
            if ((uVar8 & 0x7fff) != 0) {
              uVar4 = 0x1f;
              if ((uVar8 & 0x7fff) != 0) {
                for (; uVar12 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                }
              }
              iVar6 = (uVar4 ^ 0x1f) - 8;
              uVar9 = (uVar9 | uVar12 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar12 < 0xf800000) {
            uVar9 = (uVar9 | uVar12) + 0x38000000;
          }
          else {
            uVar9 = uVar9 | uVar12 | 0x7f800000;
          }
          *(uint *)(puVar10 + lVar13 + 4) = uVar9;
          uVar8 = (uint)*psVar14;
          uVar12 = (uVar8 & 0x7fff) << 0xd;
          uVar9 = uVar8 & 0x80000000;
          if (uVar12 < 0x800000) {
            if ((uVar8 & 0x7fff) != 0) {
              uVar4 = 0x1f;
              if ((uVar8 & 0x7fff) != 0) {
                for (; uVar12 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                }
              }
              iVar6 = (uVar4 ^ 0x1f) - 8;
              uVar9 = (uVar9 | uVar12 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar12 < 0xf800000) {
            uVar9 = (uVar9 | uVar12) + 0x38000000;
          }
          else {
            uVar9 = uVar9 | uVar12 | 0x7f800000;
          }
          *(uint *)(puVar10 + lVar13 + 8) = uVar9;
          psVar14 = psVar14 + 1;
          lVar13 = lVar13 + 0xc;
        } while ((ulong)uVar1 * 0xc != lVar13);
      }
      psVar11 = (short *)((long)psVar11 + (long)(int)(uVar1 * 6));
      puVar10 = puVar10 + iVar2;
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar5);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_3chan_interleave_rev (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[2].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 6;

    /* interleaving case, we can do this! */
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        float* out = (float*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in2[x]));
            out[1] = half_to_float (one_to_native16 (in1[x]));
            out[2] = half_to_float (one_to_native16 (in0[x]));
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}